

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

xmlCharEncoding xmlParseCharEncoding(char *name)

{
  __int32_t _Var1;
  int iVar2;
  char *pcVar3;
  __int32_t **pp_Var4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  char upper [500];
  
  if (name != (char *)0x0) {
    pcVar3 = xmlGetEncodingAlias(name);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = name;
    }
    for (lVar5 = 0; lVar5 != 499; lVar5 = lVar5 + 1) {
      pp_Var4 = __ctype_toupper_loc();
      _Var1 = (*pp_Var4)[pcVar3[lVar5]];
      upper[lVar5] = (char)_Var1;
      if ((char)_Var1 == '\0') break;
    }
    upper[lVar5] = '\0';
    if (upper[0] != '\0') {
      iVar2 = bcmp(upper,"UTF-8",6);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_UTF8;
      }
      iVar2 = bcmp(upper,"UTF8",5);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_UTF8;
      }
      iVar2 = bcmp(upper,"UTF-16",7);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_UTF16LE;
      }
      iVar2 = bcmp(upper,"UTF16",6);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_UTF16LE;
      }
      auVar6[0] = -(upper[0] == 'I');
      auVar6[1] = -(upper[1] == 'S');
      auVar6[2] = -(upper[2] == 'O');
      auVar6[3] = -(upper[3] == '-');
      auVar6[4] = -(upper[4] == '1');
      auVar6[5] = -(upper[5] == '0');
      auVar6[6] = -(upper[6] == '6');
      auVar6[7] = -(upper[7] == '4');
      auVar6[8] = -(upper[8] == '6');
      auVar6[9] = -(upper[9] == '-');
      auVar6[10] = -(upper[10] == 'U');
      auVar6[0xb] = -(upper[0xb] == 'C');
      auVar6[0xc] = -(upper[0xc] == 'S');
      auVar6[0xd] = -(upper[0xd] == '-');
      auVar6[0xe] = -(upper[0xe] == '2');
      auVar6[0xf] = -(upper[0xf] == '\0');
      if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe | (ushort)(auVar6[0xf] >> 7) << 0xf
                  ) == 0xffff) {
        return XML_CHAR_ENCODING_UCS2;
      }
      iVar2 = bcmp(upper,"UCS-2",6);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_UCS2;
      }
      iVar2 = bcmp(upper,"UCS2",5);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_UCS2;
      }
      auVar7[0] = -(upper[0] == 'I');
      auVar7[1] = -(upper[1] == 'S');
      auVar7[2] = -(upper[2] == 'O');
      auVar7[3] = -(upper[3] == '-');
      auVar7[4] = -(upper[4] == '1');
      auVar7[5] = -(upper[5] == '0');
      auVar7[6] = -(upper[6] == '6');
      auVar7[7] = -(upper[7] == '4');
      auVar7[8] = -(upper[8] == '6');
      auVar7[9] = -(upper[9] == '-');
      auVar7[10] = -(upper[10] == 'U');
      auVar7[0xb] = -(upper[0xb] == 'C');
      auVar7[0xc] = -(upper[0xc] == 'S');
      auVar7[0xd] = -(upper[0xd] == '-');
      auVar7[0xe] = -(upper[0xe] == '4');
      auVar7[0xf] = -(upper[0xf] == '\0');
      if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe | (ushort)(auVar7[0xf] >> 7) << 0xf
                  ) == 0xffff) {
        return XML_CHAR_ENCODING_UCS4LE;
      }
      iVar2 = bcmp(upper,"UCS-4",6);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_UCS4LE;
      }
      iVar2 = bcmp(upper,"UCS4",5);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_UCS4LE;
      }
      iVar2 = bcmp(upper,"ISO-8859-1",0xb);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_8859_1;
      }
      iVar2 = bcmp(upper,"ISO-LATIN-1",0xc);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_8859_1;
      }
      iVar2 = bcmp(upper,"ISO LATIN 1",0xc);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_8859_1;
      }
      iVar2 = bcmp(upper,"ISO-8859-2",0xb);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_8859_2;
      }
      iVar2 = bcmp(upper,"ISO-LATIN-2",0xc);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_8859_2;
      }
      iVar2 = bcmp(upper,"ISO LATIN 2",0xc);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_8859_2;
      }
      iVar2 = bcmp(upper,"ISO-8859-3",0xb);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_8859_3;
      }
      iVar2 = bcmp(upper,"ISO-8859-4",0xb);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_8859_4;
      }
      iVar2 = bcmp(upper,"ISO-8859-5",0xb);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_8859_5;
      }
      iVar2 = bcmp(upper,"ISO-8859-6",0xb);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_8859_6;
      }
      iVar2 = bcmp(upper,"ISO-8859-7",0xb);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_8859_7;
      }
      iVar2 = bcmp(upper,"ISO-8859-8",0xb);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_8859_8;
      }
      iVar2 = bcmp(upper,"ISO-8859-9",0xb);
      if (iVar2 == 0) {
        return XML_CHAR_ENCODING_8859_9;
      }
      iVar2 = bcmp(upper,"ISO-2022-JP",0xc);
      if (iVar2 != 0) {
        iVar2 = bcmp(upper,"SHIFT_JIS",10);
        if (iVar2 == 0) {
          return XML_CHAR_ENCODING_SHIFT_JIS;
        }
        iVar2 = bcmp(upper,"EUC-JP",7);
        return -(uint)(iVar2 != 0) | XML_CHAR_ENCODING_EUC_JP;
      }
      return XML_CHAR_ENCODING_2022_JP;
    }
  }
  return XML_CHAR_ENCODING_NONE;
}

Assistant:

xmlCharEncoding
xmlParseCharEncoding(const char* name)
{
    const char *alias;
    char upper[500];
    int i;

    if (name == NULL)
	return(XML_CHAR_ENCODING_NONE);

    /*
     * Do the alias resolution
     */
    alias = xmlGetEncodingAlias(name);
    if (alias != NULL)
	name = alias;

    for (i = 0;i < 499;i++) {
        upper[i] = toupper(name[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;

    if (!strcmp(upper, "")) return(XML_CHAR_ENCODING_NONE);
    if (!strcmp(upper, "UTF-8")) return(XML_CHAR_ENCODING_UTF8);
    if (!strcmp(upper, "UTF8")) return(XML_CHAR_ENCODING_UTF8);

    /*
     * NOTE: if we were able to parse this, the endianness of UTF16 is
     *       already found and in use
     */
    if (!strcmp(upper, "UTF-16")) return(XML_CHAR_ENCODING_UTF16LE);
    if (!strcmp(upper, "UTF16")) return(XML_CHAR_ENCODING_UTF16LE);

    if (!strcmp(upper, "ISO-10646-UCS-2")) return(XML_CHAR_ENCODING_UCS2);
    if (!strcmp(upper, "UCS-2")) return(XML_CHAR_ENCODING_UCS2);
    if (!strcmp(upper, "UCS2")) return(XML_CHAR_ENCODING_UCS2);

    /*
     * NOTE: if we were able to parse this, the endianness of UCS4 is
     *       already found and in use
     */
    if (!strcmp(upper, "ISO-10646-UCS-4")) return(XML_CHAR_ENCODING_UCS4LE);
    if (!strcmp(upper, "UCS-4")) return(XML_CHAR_ENCODING_UCS4LE);
    if (!strcmp(upper, "UCS4")) return(XML_CHAR_ENCODING_UCS4LE);


    if (!strcmp(upper,  "ISO-8859-1")) return(XML_CHAR_ENCODING_8859_1);
    if (!strcmp(upper,  "ISO-LATIN-1")) return(XML_CHAR_ENCODING_8859_1);
    if (!strcmp(upper,  "ISO LATIN 1")) return(XML_CHAR_ENCODING_8859_1);

    if (!strcmp(upper,  "ISO-8859-2")) return(XML_CHAR_ENCODING_8859_2);
    if (!strcmp(upper,  "ISO-LATIN-2")) return(XML_CHAR_ENCODING_8859_2);
    if (!strcmp(upper,  "ISO LATIN 2")) return(XML_CHAR_ENCODING_8859_2);

    if (!strcmp(upper,  "ISO-8859-3")) return(XML_CHAR_ENCODING_8859_3);
    if (!strcmp(upper,  "ISO-8859-4")) return(XML_CHAR_ENCODING_8859_4);
    if (!strcmp(upper,  "ISO-8859-5")) return(XML_CHAR_ENCODING_8859_5);
    if (!strcmp(upper,  "ISO-8859-6")) return(XML_CHAR_ENCODING_8859_6);
    if (!strcmp(upper,  "ISO-8859-7")) return(XML_CHAR_ENCODING_8859_7);
    if (!strcmp(upper,  "ISO-8859-8")) return(XML_CHAR_ENCODING_8859_8);
    if (!strcmp(upper,  "ISO-8859-9")) return(XML_CHAR_ENCODING_8859_9);

    if (!strcmp(upper, "ISO-2022-JP")) return(XML_CHAR_ENCODING_2022_JP);
    if (!strcmp(upper, "SHIFT_JIS")) return(XML_CHAR_ENCODING_SHIFT_JIS);
    if (!strcmp(upper, "EUC-JP")) return(XML_CHAR_ENCODING_EUC_JP);

#ifdef DEBUG_ENCODING
    xmlGenericError(xmlGenericErrorContext, "Unknown encoding %s\n", name);
#endif
    return(XML_CHAR_ENCODING_ERROR);
}